

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::StressTestConfig::Serialize(StressTestConfig *this,Message *msg)

{
  bool bVar1;
  TraceConfig *this_00;
  StressTestConfig_WriterTiming *pSVar2;
  Message *pMVar3;
  void *data;
  size_t size;
  Message *msg_local;
  StressTestConfig *this_local;
  
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    this_00 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig>::operator*
                        (&this->trace_config_);
    pMVar3 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,1);
    TraceConfig::Serialize(this_00,pMVar3);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,2,this->shmem_size_kb_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,3,this->shmem_page_size_kb_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,4,this->num_processes_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,5,this->num_threads_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->max_events_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,7);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,7,this->nesting_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,8);
  if (bVar1) {
    pSVar2 = protozero::CopyablePtr<perfetto::protos::gen::StressTestConfig_WriterTiming>::operator*
                       (&this->steady_state_timings_);
    pMVar3 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,8);
    StressTestConfig_WriterTiming::Serialize(pSVar2,pMVar3);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,9);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,9,this->burst_period_ms_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,10);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,10,this->burst_duration_ms_);
  }
  bVar1 = std::bitset<12UL>::operator[](&this->_has_field_,0xb);
  if (bVar1) {
    pSVar2 = protozero::CopyablePtr<perfetto::protos::gen::StressTestConfig_WriterTiming>::operator*
                       (&this->burst_timings_);
    pMVar3 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0xb);
    StressTestConfig_WriterTiming::Serialize(pSVar2,pMVar3);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void StressTestConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: trace_config
  if (_has_field_[1]) {
    (*trace_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: shmem_size_kb
  if (_has_field_[2]) {
    msg->AppendVarInt(2, shmem_size_kb_);
  }

  // Field 3: shmem_page_size_kb
  if (_has_field_[3]) {
    msg->AppendVarInt(3, shmem_page_size_kb_);
  }

  // Field 4: num_processes
  if (_has_field_[4]) {
    msg->AppendVarInt(4, num_processes_);
  }

  // Field 5: num_threads
  if (_has_field_[5]) {
    msg->AppendVarInt(5, num_threads_);
  }

  // Field 6: max_events
  if (_has_field_[6]) {
    msg->AppendVarInt(6, max_events_);
  }

  // Field 7: nesting
  if (_has_field_[7]) {
    msg->AppendVarInt(7, nesting_);
  }

  // Field 8: steady_state_timings
  if (_has_field_[8]) {
    (*steady_state_timings_).Serialize(msg->BeginNestedMessage<::protozero::Message>(8));
  }

  // Field 9: burst_period_ms
  if (_has_field_[9]) {
    msg->AppendVarInt(9, burst_period_ms_);
  }

  // Field 10: burst_duration_ms
  if (_has_field_[10]) {
    msg->AppendVarInt(10, burst_duration_ms_);
  }

  // Field 11: burst_timings
  if (_has_field_[11]) {
    (*burst_timings_).Serialize(msg->BeginNestedMessage<::protozero::Message>(11));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}